

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O0

void calc_light(player *p,player_state_conflict *state,_Bool update)

{
  _Bool _Var1;
  object *obj_00;
  object *obj;
  wchar_t local_20;
  wchar_t amt;
  wchar_t i;
  _Bool update_local;
  player_state_conflict *state_local;
  player *p_local;
  
  state->cur_light = L'\0';
  if (((p->depth == 0) && (_Var1 = is_daytime(), _Var1)) && (update)) {
    if ((p->state).cur_light != state->cur_light) {
      p->upkeep->update = p->upkeep->update | 0xc0;
    }
  }
  else {
    for (local_20 = L'\0'; local_20 < (int)(uint)(p->body).count; local_20 = local_20 + L'\x01') {
      obj._4_4_ = 0;
      obj_00 = slot_object(p,local_20);
      if (obj_00 != (object *)0x0) {
        _Var1 = flag_has_dbg(obj_00->flags,6,0x22,"obj->flags","OF_LIGHT_2");
        if (_Var1) {
          obj._4_4_ = 2;
        }
        else {
          _Var1 = flag_has_dbg(obj_00->flags,6,0x23,"obj->flags","OF_LIGHT_3");
          if (_Var1) {
            obj._4_4_ = 3;
          }
        }
        obj._4_4_ = obj_00->modifiers[0xd] + obj._4_4_;
        if ((0 < obj_00->modifiers[0xd]) &&
           (_Var1 = flag_has_dbg(state->pflags,10,0x1f,"state->pflags","PF_UNLIGHT"), _Var1)) {
          obj._4_4_ = obj._4_4_ + -1;
        }
        _Var1 = tval_is_light(obj_00);
        if (((_Var1) &&
            (_Var1 = flag_has_dbg(obj_00->flags,6,0x19,"obj->flags","OF_NO_FUEL"), !_Var1)) &&
           (obj_00->timeout == 0)) {
          obj._4_4_ = 0;
        }
        state->cur_light = obj._4_4_ + state->cur_light;
      }
    }
    _Var1 = flag_has_dbg(state->pflags,10,0x2e,"state->pflags","PF_HOLY");
    if (_Var1) {
      if ((p->lev < 0x24) ||
         (_Var1 = flag_has_dbg(state->pflags,10,0x2d,"state->pflags","PF_STRONG_MAGIC"), !_Var1)) {
        if (0x2d < p->lev) {
          state->cur_light = state->cur_light + L'\x01';
        }
      }
      else {
        state->cur_light = state->cur_light + L'\x01';
      }
    }
    _Var1 = flag_has_dbg(state->pflags,10,0x4e,"state->pflags","PF_HOLY_LIGHT");
    if (_Var1) {
      state->cur_light = state->cur_light + L'\x01';
    }
  }
  return;
}

Assistant:

static void calc_light(struct player *p, struct player_state *state,
					   bool update)
{
	int i;

	/* Assume no light */
	state->cur_light = 0;

	/* Ascertain lightness if in the town */
	if (!p->depth && is_daytime() && update) {
		/* Update the visuals if necessary*/
		if (p->state.cur_light != state->cur_light)
			p->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

		return;
	}

	/* Examine all wielded objects, use the brightest */
	for (i = 0; i < p->body.count; i++) {
		int amt = 0;
		struct object *obj = slot_object(p, i);

		/* Skip empty slots */
		if (!obj) continue;

		/* Light radius - innate plus modifier */
		if (of_has(obj->flags, OF_LIGHT_2)) {
			amt = 2;
		} else if (of_has(obj->flags, OF_LIGHT_3)) {
			amt = 3;
		}
		amt += obj->modifiers[OBJ_MOD_LIGHT];

		/* Adjustment to allow UNLIGHT players to use +1 LIGHT gear */
		if ((obj->modifiers[OBJ_MOD_LIGHT] > 0) && pf_has(state->pflags, PF_UNLIGHT)) {
			amt--;
		}

		/* Examine actual lights */
		if (tval_is_light(obj) && !of_has(obj->flags, OF_NO_FUEL) &&
				obj->timeout == 0)
			/* Lights without fuel provide no light */
			amt = 0;

		/* Alter p->state.cur_light if reasonable */
	    state->cur_light += amt;
	}

	/* Class ability Holy */
	if (pf_has(state->pflags, PF_HOLY)) {
		if ((p->lev > 35) && pf_has(state->pflags, PF_STRONG_MAGIC)) {
			state->cur_light++;
		} else if (p->lev > 45) {
			state->cur_light++;
		}
	}

	/* Special ability Holy Light */
	if (pf_has(state->pflags, PF_HOLY_LIGHT)) {
		state->cur_light++;
	}
}